

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_tests.cpp
# Opt level: O3

void __thiscall hash_tests::siphash::test_method(siphash *this)

{
  byte bVar1;
  ulong uVar2;
  uint64_t k0;
  uint64_t k1;
  uint64_t uVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  iterator in_R8;
  iterator pvVar7;
  iterator in_R9;
  iterator pvVar8;
  ulong uVar9;
  ulong uVar10;
  long in_FS_OFFSET;
  bool bVar11;
  const_string file;
  Span<const_unsigned_char> data;
  const_string file_00;
  Span<const_unsigned_char> data_00;
  const_string file_01;
  const_string file_02;
  Span<const_unsigned_char> data_01;
  const_string file_03;
  Span<const_unsigned_char> data_02;
  const_string file_04;
  Span<const_unsigned_char> data_03;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  Span<const_unsigned_char> data_04;
  const_string file_10;
  const_string file_11;
  Span<std::byte> output;
  Span<const_unsigned_char> data_05;
  Span<const_unsigned_char> data_06;
  const_string file_12;
  const_string file_13;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  undefined **local_530;
  undefined1 *local_510;
  undefined1 *local_508;
  char *local_500;
  char *local_4f8;
  uint64_t local_4f0;
  uint64_t local_4e8;
  lazy_ostream local_4e0;
  undefined1 *local_4d0;
  char *local_4c8;
  undefined1 *local_4c0;
  undefined1 *local_4b8;
  char *local_4b0;
  char *local_4a8;
  undefined1 *local_4a0;
  undefined1 *local_498;
  char *local_490;
  char *local_488;
  CMutableTransaction tx;
  undefined1 *local_448;
  undefined1 *local_440;
  char *local_438;
  char *local_430;
  undefined1 *local_428;
  undefined1 *local_420;
  char *local_418;
  char *local_410;
  undefined1 *local_408;
  undefined1 *local_400;
  char *local_3f8;
  char *local_3f0;
  undefined1 *local_3e8;
  undefined1 *local_3e0;
  char *local_3d8;
  char *local_3d0;
  undefined1 *local_3c8;
  undefined1 *local_3c0;
  char *local_3b8;
  char *local_3b0;
  undefined1 *local_3a8;
  undefined1 *local_3a0;
  char *local_398;
  char *local_390;
  undefined1 *local_388;
  undefined1 *local_380;
  char *local_378;
  char *local_370;
  undefined1 *local_368;
  undefined1 *local_360;
  char *local_358;
  char *local_350;
  undefined1 *local_348;
  undefined1 *local_340;
  char *local_338;
  char *local_330;
  undefined1 *local_328;
  undefined1 *local_320;
  char *local_318;
  char *local_310;
  undefined1 *local_308;
  undefined1 *local_300;
  char *local_2f8;
  char *local_2f0;
  undefined1 *local_2e8;
  undefined1 *local_2e0;
  char *local_2d8;
  char *local_2d0;
  uint64_t *local_2c8;
  assertion_result local_2c0;
  uint64_t **local_2a8;
  uint64_t *local_2a0;
  _func_int *local_298;
  char *local_290;
  assertion_result local_288;
  uint8_t nb [4];
  CSipHasher sip288;
  CSipHasher sip256;
  uint256 x;
  FastRandomContext ctx;
  HashWriter ss;
  CSipHasher hasher3;
  CSipHasher hasher2;
  CSipHasher hasher;
  undefined1 local_58 [24];
  uint64_t **local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  CSipHasher::CSipHasher(&hasher,0x706050403020100,0xf0e0d0c0b0a0908);
  local_2d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/hash_tests.cpp"
  ;
  local_2d0 = "";
  local_2e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2e0 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x54;
  file.m_begin = (iterator)&local_2d8;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_2e8,msg);
  tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_finish
  ._0_1_ = 0;
  tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)&PTR__lazy_ostream_01388f08;
  tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)anon_var_dwarf_a98d45;
  local_58._0_8_ = CSipHasher::Finalize(&hasher);
  sip256.v[0] = (uint64_t)local_58;
  hasher2.v[0] = CONCAT71(hasher2.v[0]._1_7_,local_58._0_8_ == 0x726fdb47dd0e0e31);
  sip288.v[0] = (uint64_t)&local_2c0;
  local_2c0._0_8_ = (undefined **)0x726fdb47dd0e0e31;
  hasher2.v[1] = 0;
  hasher2.v[2] = 0;
  hasher3.v[0] = (uint64_t)anon_var_dwarf_a95aad;
  hasher3.v[1] = (long)
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/hash_tests.cpp"
                 + 99;
  ctx.super_RandomMixin<FastRandomContext>._8_8_ =
       ctx.super_RandomMixin<FastRandomContext>._8_8_ & 0xffffffffffffff00;
  ctx.super_RandomMixin<FastRandomContext>.bitbuf = (uint64_t)&PTR__lazy_ostream_01388f48;
  ctx.rng.m_aligned.input._0_8_ = boost::unit_test::lazy_ostream::inst;
  ss.ctx.s._24_8_ = &sip288;
  ss.ctx.s._8_8_ = ss.ctx.s._8_8_ & 0xffffffffffffff00;
  ss.ctx.s._0_8_ = &PTR__lazy_ostream_0138a900;
  ss.ctx.s._16_8_ = boost::unit_test::lazy_ostream::inst;
  pvVar7 = (iterator)0x1;
  pvVar8 = (iterator)0x2;
  ctx.rng.m_aligned.input._8_8_ = &sip256;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&hasher2,(lazy_ostream *)&tx,1,2,REQUIRE,0xe74e9d,(size_t)&hasher3,
             0x54,&ctx,"0x726fdb47dd0e0e31ull",&ss);
  boost::detail::shared_count::~shared_count((shared_count *)(hasher2.v + 2));
  data.m_size = 1;
  data.m_data = (uchar *)"";
  CSipHasher::Write(&hasher,data);
  local_2f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/hash_tests.cpp"
  ;
  local_2f0 = "";
  local_308 = &boost::unit_test::basic_cstring<char_const>::null;
  local_300 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x57;
  file_00.m_begin = (iterator)&local_2f8;
  msg_00.m_end = pvVar8;
  msg_00.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_308,
             msg_00);
  tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_finish
  ._0_1_ = 0;
  tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)&PTR__lazy_ostream_01388f08;
  tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)anon_var_dwarf_a98d45;
  local_58._0_8_ = CSipHasher::Finalize(&hasher);
  local_2c0._0_8_ = (undefined **)0x74f839c593dc67fd;
  hasher2.v[0] = CONCAT71(hasher2.v[0]._1_7_,local_58._0_8_ == 0x74f839c593dc67fd);
  hasher2.v[1] = 0;
  hasher2.v[2] = 0;
  hasher3.v[0] = (uint64_t)anon_var_dwarf_a95aad;
  hasher3.v[1] = (long)
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/hash_tests.cpp"
                 + 99;
  sip256.v[0] = (uint64_t)local_58;
  ctx.super_RandomMixin<FastRandomContext>._8_8_ =
       ctx.super_RandomMixin<FastRandomContext>._8_8_ & 0xffffffffffffff00;
  ctx.super_RandomMixin<FastRandomContext>.bitbuf = (uint64_t)&PTR__lazy_ostream_01388f48;
  ctx.rng.m_aligned.input._0_8_ = boost::unit_test::lazy_ostream::inst;
  sip288.v[0] = (uint64_t)&local_2c0;
  ss.ctx.s._8_8_ = ss.ctx.s._8_8_ & 0xffffffffffffff00;
  ss.ctx.s._0_8_ = &PTR__lazy_ostream_0138a900;
  ss.ctx.s._16_8_ = boost::unit_test::lazy_ostream::inst;
  ss.ctx.s._24_8_ = &sip288;
  pvVar7 = (iterator)0x1;
  pvVar8 = (iterator)0x2;
  ctx.rng.m_aligned.input._8_8_ = &sip256;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&hasher2,(lazy_ostream *)&tx,1,2,REQUIRE,0xe74e9d,(size_t)&hasher3,
             0x57,&ctx,"0x74f839c593dc67fdull",&ss);
  boost::detail::shared_count::~shared_count((shared_count *)(hasher2.v + 2));
  data_00.m_size = 7;
  data_00.m_data = "\x01\x02\x03\x04\x05\x06\a";
  CSipHasher::Write(&hasher,data_00);
  local_318 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/hash_tests.cpp"
  ;
  local_310 = "";
  local_328 = &boost::unit_test::basic_cstring<char_const>::null;
  local_320 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x5a;
  file_01.m_begin = (iterator)&local_318;
  msg_01.m_end = pvVar8;
  msg_01.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_328,
             msg_01);
  tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_finish
  ._0_1_ = 0;
  tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)&PTR__lazy_ostream_01388f08;
  tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)anon_var_dwarf_a98d45;
  local_58._0_8_ = CSipHasher::Finalize(&hasher);
  local_2c0._0_8_ = (undefined **)0x93f5f5799a932462;
  hasher2.v[0] = CONCAT71(hasher2.v[0]._1_7_,local_58._0_8_ == 0x93f5f5799a932462);
  hasher2.v[1] = 0;
  hasher2.v[2] = 0;
  hasher3.v[0] = (uint64_t)anon_var_dwarf_a95aad;
  hasher3.v[1] = (long)
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/hash_tests.cpp"
                 + 99;
  sip256.v[0] = (uint64_t)local_58;
  ctx.super_RandomMixin<FastRandomContext>._8_8_ =
       ctx.super_RandomMixin<FastRandomContext>._8_8_ & 0xffffffffffffff00;
  ctx.super_RandomMixin<FastRandomContext>.bitbuf = (uint64_t)&PTR__lazy_ostream_01388f48;
  ctx.rng.m_aligned.input._0_8_ = boost::unit_test::lazy_ostream::inst;
  sip288.v[0] = (uint64_t)&local_2c0;
  ss.ctx.s._8_8_ = ss.ctx.s._8_8_ & 0xffffffffffffff00;
  ss.ctx.s._0_8_ = &PTR__lazy_ostream_0138a900;
  ss.ctx.s._16_8_ = boost::unit_test::lazy_ostream::inst;
  ss.ctx.s._24_8_ = &sip288;
  pvVar7 = (iterator)0x1;
  pvVar8 = (iterator)0x2;
  ctx.rng.m_aligned.input._8_8_ = &sip256;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&hasher2,(lazy_ostream *)&tx,1,2,REQUIRE,0xe74e9d,(size_t)&hasher3,
             0x5a,&ctx,"0x93f5f5799a932462ull",&ss);
  boost::detail::shared_count::~shared_count((shared_count *)(hasher2.v + 2));
  CSipHasher::Write(&hasher,0xf0e0d0c0b0a0908);
  local_338 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/hash_tests.cpp"
  ;
  local_330 = "";
  local_348 = &boost::unit_test::basic_cstring<char_const>::null;
  local_340 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x5c;
  file_02.m_begin = (iterator)&local_338;
  msg_02.m_end = pvVar8;
  msg_02.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_348,
             msg_02);
  tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_finish
  ._0_1_ = 0;
  tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)&PTR__lazy_ostream_01388f08;
  tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)anon_var_dwarf_a98d45;
  local_58._0_8_ = CSipHasher::Finalize(&hasher);
  local_2c0._0_8_ = (undefined **)0x3f2acc7f57c29bdb;
  hasher2.v[0] = CONCAT71(hasher2.v[0]._1_7_,local_58._0_8_ == 0x3f2acc7f57c29bdb);
  hasher2.v[1] = 0;
  hasher2.v[2] = 0;
  hasher3.v[0] = (uint64_t)anon_var_dwarf_a95aad;
  hasher3.v[1] = (long)
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/hash_tests.cpp"
                 + 99;
  sip256.v[0] = (uint64_t)local_58;
  ctx.super_RandomMixin<FastRandomContext>._8_8_ =
       ctx.super_RandomMixin<FastRandomContext>._8_8_ & 0xffffffffffffff00;
  ctx.super_RandomMixin<FastRandomContext>.bitbuf = (uint64_t)&PTR__lazy_ostream_01388f48;
  ctx.rng.m_aligned.input._0_8_ = boost::unit_test::lazy_ostream::inst;
  sip288.v[0] = (uint64_t)&local_2c0;
  ss.ctx.s._8_8_ = ss.ctx.s._8_8_ & 0xffffffffffffff00;
  ss.ctx.s._0_8_ = &PTR__lazy_ostream_0138a900;
  ss.ctx.s._16_8_ = boost::unit_test::lazy_ostream::inst;
  ss.ctx.s._24_8_ = &sip288;
  pvVar7 = (iterator)0x1;
  pvVar8 = (iterator)0x2;
  ctx.rng.m_aligned.input._8_8_ = &sip256;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&hasher2,(lazy_ostream *)&tx,1,2,REQUIRE,0xe74e9d,(size_t)&hasher3,
             0x5c,&ctx,"0x3f2acc7f57c29bdbull",&ss);
  boost::detail::shared_count::~shared_count((shared_count *)(hasher2.v + 2));
  data_01.m_size = 2;
  data_01.m_data = "\x10\x11";
  CSipHasher::Write(&hasher,data_01);
  local_358 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/hash_tests.cpp"
  ;
  local_350 = "";
  local_368 = &boost::unit_test::basic_cstring<char_const>::null;
  local_360 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x5f;
  file_03.m_begin = (iterator)&local_358;
  msg_03.m_end = pvVar8;
  msg_03.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_368,
             msg_03);
  tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_finish
  ._0_1_ = 0;
  tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)&PTR__lazy_ostream_01388f08;
  tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)anon_var_dwarf_a98d45;
  local_58._0_8_ = CSipHasher::Finalize(&hasher);
  local_2c0._0_8_ = (undefined **)0x4bc1b3f0968dd39c;
  hasher2.v[0] = CONCAT71(hasher2.v[0]._1_7_,local_58._0_8_ == 0x4bc1b3f0968dd39c);
  hasher2.v[1] = 0;
  hasher2.v[2] = 0;
  hasher3.v[0] = (uint64_t)anon_var_dwarf_a95aad;
  hasher3.v[1] = (long)
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/hash_tests.cpp"
                 + 99;
  sip256.v[0] = (uint64_t)local_58;
  ctx.super_RandomMixin<FastRandomContext>._8_8_ =
       ctx.super_RandomMixin<FastRandomContext>._8_8_ & 0xffffffffffffff00;
  ctx.super_RandomMixin<FastRandomContext>.bitbuf = (uint64_t)&PTR__lazy_ostream_01388f48;
  ctx.rng.m_aligned.input._0_8_ = boost::unit_test::lazy_ostream::inst;
  sip288.v[0] = (uint64_t)&local_2c0;
  ss.ctx.s._8_8_ = ss.ctx.s._8_8_ & 0xffffffffffffff00;
  ss.ctx.s._0_8_ = &PTR__lazy_ostream_0138a900;
  ss.ctx.s._16_8_ = boost::unit_test::lazy_ostream::inst;
  ss.ctx.s._24_8_ = &sip288;
  pvVar7 = (iterator)0x1;
  pvVar8 = (iterator)0x2;
  ctx.rng.m_aligned.input._8_8_ = &sip256;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&hasher2,(lazy_ostream *)&tx,1,2,REQUIRE,0xe74e9d,(size_t)&hasher3,
             0x5f,&ctx,"0x4bc1b3f0968dd39cull",&ss);
  boost::detail::shared_count::~shared_count((shared_count *)(hasher2.v + 2));
  data_02.m_size = 9;
  data_02.m_data = "\x12\x13\x14\x15\x16\x17\x18\x19\x1a";
  CSipHasher::Write(&hasher,data_02);
  local_378 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/hash_tests.cpp"
  ;
  local_370 = "";
  local_388 = &boost::unit_test::basic_cstring<char_const>::null;
  local_380 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x62;
  file_04.m_begin = (iterator)&local_378;
  msg_04.m_end = pvVar8;
  msg_04.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_388,
             msg_04);
  tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_finish
  ._0_1_ = 0;
  tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)&PTR__lazy_ostream_01388f08;
  tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)anon_var_dwarf_a98d45;
  local_58._0_8_ = CSipHasher::Finalize(&hasher);
  local_2c0._0_8_ = (undefined **)0x2f2e6163076bcfad;
  hasher2.v[0] = CONCAT71(hasher2.v[0]._1_7_,local_58._0_8_ == 0x2f2e6163076bcfad);
  hasher2.v[1] = 0;
  hasher2.v[2] = 0;
  hasher3.v[0] = (uint64_t)anon_var_dwarf_a95aad;
  hasher3.v[1] = (long)
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/hash_tests.cpp"
                 + 99;
  sip256.v[0] = (uint64_t)local_58;
  ctx.super_RandomMixin<FastRandomContext>._8_8_ =
       ctx.super_RandomMixin<FastRandomContext>._8_8_ & 0xffffffffffffff00;
  ctx.super_RandomMixin<FastRandomContext>.bitbuf = (uint64_t)&PTR__lazy_ostream_01388f48;
  ctx.rng.m_aligned.input._0_8_ = boost::unit_test::lazy_ostream::inst;
  sip288.v[0] = (uint64_t)&local_2c0;
  ss.ctx.s._8_8_ = ss.ctx.s._8_8_ & 0xffffffffffffff00;
  ss.ctx.s._0_8_ = &PTR__lazy_ostream_0138a900;
  ss.ctx.s._16_8_ = boost::unit_test::lazy_ostream::inst;
  ss.ctx.s._24_8_ = &sip288;
  pvVar7 = (iterator)0x1;
  pvVar8 = (iterator)0x2;
  ctx.rng.m_aligned.input._8_8_ = &sip256;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&hasher2,(lazy_ostream *)&tx,1,2,REQUIRE,0xe74e9d,(size_t)&hasher3,
             0x62,&ctx,"0x2f2e6163076bcfadull",&ss);
  boost::detail::shared_count::~shared_count((shared_count *)(hasher2.v + 2));
  data_03.m_size = 5;
  data_03.m_data = "\x1b\x1c\x1d\x1e\x1f";
  CSipHasher::Write(&hasher,data_03);
  local_398 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/hash_tests.cpp"
  ;
  local_390 = "";
  local_3a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x65;
  file_05.m_begin = (iterator)&local_398;
  msg_05.m_end = pvVar8;
  msg_05.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_3a8,
             msg_05);
  tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_finish
  ._0_1_ = 0;
  tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)&PTR__lazy_ostream_01388f08;
  tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)anon_var_dwarf_a98d45;
  local_58._0_8_ = CSipHasher::Finalize(&hasher);
  local_2c0._0_8_ = (undefined **)0x7127512f72f27cce;
  hasher2.v[0] = CONCAT71(hasher2.v[0]._1_7_,local_58._0_8_ == 0x7127512f72f27cce);
  hasher2.v[1] = 0;
  hasher2.v[2] = 0;
  hasher3.v[0] = (uint64_t)anon_var_dwarf_a95aad;
  hasher3.v[1] = (long)
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/hash_tests.cpp"
                 + 99;
  sip256.v[0] = (uint64_t)local_58;
  ctx.super_RandomMixin<FastRandomContext>._8_8_ =
       ctx.super_RandomMixin<FastRandomContext>._8_8_ & 0xffffffffffffff00;
  ctx.super_RandomMixin<FastRandomContext>.bitbuf = (uint64_t)&PTR__lazy_ostream_01388f48;
  ctx.rng.m_aligned.input._0_8_ = boost::unit_test::lazy_ostream::inst;
  sip288.v[0] = (uint64_t)&local_2c0;
  ss.ctx.s._8_8_ = ss.ctx.s._8_8_ & 0xffffffffffffff00;
  ss.ctx.s._0_8_ = &PTR__lazy_ostream_0138a900;
  ss.ctx.s._16_8_ = boost::unit_test::lazy_ostream::inst;
  ss.ctx.s._24_8_ = &sip288;
  pvVar7 = (iterator)0x1;
  pvVar8 = (iterator)0x2;
  ctx.rng.m_aligned.input._8_8_ = &sip256;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&hasher2,(lazy_ostream *)&tx,1,2,REQUIRE,0xe74e9d,(size_t)&hasher3,
             0x65,&ctx,"0x7127512f72f27cceull",&ss);
  boost::detail::shared_count::~shared_count((shared_count *)(hasher2.v + 2));
  CSipHasher::Write(&hasher,0x2726252423222120);
  local_3b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/hash_tests.cpp"
  ;
  local_3b0 = "";
  local_3c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x67;
  file_06.m_begin = (iterator)&local_3b8;
  msg_06.m_end = pvVar8;
  msg_06.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_3c8,
             msg_06);
  tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_finish
  ._0_1_ = 0;
  tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)&PTR__lazy_ostream_01388f08;
  tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)anon_var_dwarf_a98d45;
  local_58._0_8_ = CSipHasher::Finalize(&hasher);
  local_2c0._0_8_ = (undefined **)0xe3ea96b5304a7d0;
  hasher2.v[0] = CONCAT71(hasher2.v[0]._1_7_,local_58._0_8_ == 0xe3ea96b5304a7d0);
  hasher2.v[1] = 0;
  hasher2.v[2] = 0;
  hasher3.v[0] = (uint64_t)anon_var_dwarf_a95aad;
  hasher3.v[1] = (long)
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/hash_tests.cpp"
                 + 99;
  sip256.v[0] = (uint64_t)local_58;
  ctx.super_RandomMixin<FastRandomContext>._8_8_ =
       ctx.super_RandomMixin<FastRandomContext>._8_8_ & 0xffffffffffffff00;
  ctx.super_RandomMixin<FastRandomContext>.bitbuf = (uint64_t)&PTR__lazy_ostream_01388f48;
  ctx.rng.m_aligned.input._0_8_ = boost::unit_test::lazy_ostream::inst;
  sip288.v[0] = (uint64_t)&local_2c0;
  ss.ctx.s._8_8_ = ss.ctx.s._8_8_ & 0xffffffffffffff00;
  ss.ctx.s._0_8_ = &PTR__lazy_ostream_0138a900;
  ss.ctx.s._16_8_ = boost::unit_test::lazy_ostream::inst;
  ss.ctx.s._24_8_ = &sip288;
  pvVar7 = (iterator)0x1;
  pvVar8 = (iterator)0x2;
  ctx.rng.m_aligned.input._8_8_ = &sip256;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&hasher2,(lazy_ostream *)&tx,1,2,REQUIRE,0xe74e9d,(size_t)&hasher3,
             0x67,&ctx,"0x0e3ea96b5304a7d0ull",&ss);
  boost::detail::shared_count::~shared_count((shared_count *)(hasher2.v + 2));
  CSipHasher::Write(&hasher,0x2f2e2d2c2b2a2928);
  local_3d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/hash_tests.cpp"
  ;
  local_3d0 = "";
  local_3e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3e0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0x69;
  file_07.m_begin = (iterator)&local_3d8;
  msg_07.m_end = pvVar8;
  msg_07.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_3e8,
             msg_07);
  tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_finish
  ._0_1_ = 0;
  tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)&PTR__lazy_ostream_01388f08;
  tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)anon_var_dwarf_a98d45;
  local_58._0_8_ = CSipHasher::Finalize(&hasher);
  local_2c0._0_8_ = (undefined **)0xe612a3cb9ecba951;
  hasher2.v[0] = CONCAT71(hasher2.v[0]._1_7_,local_58._0_8_ == 0xe612a3cb9ecba951);
  hasher2.v[1] = 0;
  hasher2.v[2] = 0;
  hasher3.v[0] = (uint64_t)anon_var_dwarf_a95aad;
  hasher3.v[1] = (long)
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/hash_tests.cpp"
                 + 99;
  sip256.v[0] = (uint64_t)local_58;
  ctx.super_RandomMixin<FastRandomContext>._8_8_ =
       ctx.super_RandomMixin<FastRandomContext>._8_8_ & 0xffffffffffffff00;
  ctx.super_RandomMixin<FastRandomContext>.bitbuf = (uint64_t)&PTR__lazy_ostream_01388f48;
  ctx.rng.m_aligned.input._0_8_ = boost::unit_test::lazy_ostream::inst;
  sip288.v[0] = (uint64_t)&local_2c0;
  ss.ctx.s._8_8_ = ss.ctx.s._8_8_ & 0xffffffffffffff00;
  ss.ctx.s._0_8_ = &PTR__lazy_ostream_0138a900;
  ss.ctx.s._16_8_ = boost::unit_test::lazy_ostream::inst;
  ss.ctx.s._24_8_ = &sip288;
  pvVar7 = (iterator)0x1;
  pvVar8 = (iterator)0x2;
  ctx.rng.m_aligned.input._8_8_ = &sip256;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&hasher2,(lazy_ostream *)&tx,1,2,REQUIRE,0xe74e9d,(size_t)&hasher3,
             0x69,&ctx,"0xe612a3cb9ecba951ull",&ss);
  boost::detail::shared_count::~shared_count((shared_count *)(hasher2.v + 2));
  local_3f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/hash_tests.cpp"
  ;
  local_3f0 = "";
  local_408 = &boost::unit_test::basic_cstring<char_const>::null;
  local_400 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0x6b;
  file_08.m_begin = (iterator)&local_3f8;
  msg_08.m_end = pvVar8;
  msg_08.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_408,
             msg_08);
  tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_finish
  ._0_1_ = 0;
  tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)&PTR__lazy_ostream_01388f08;
  tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)anon_var_dwarf_a98d45;
  hasher2.v[0] = 0x706050403020100;
  hasher2.v[1] = 0xf0e0d0c0b0a0908;
  hasher2.v[2] = 0x1716151413121110;
  hasher2.v[3] = 0x1f1e1d1c1b1a1918;
  local_2c0._0_8_ = SipHashUint256(0x706050403020100,0xf0e0d0c0b0a0908,(uint256 *)&hasher2);
  local_58._0_8_ = &x;
  x.super_base_blob<256U>.m_data._M_elems[0] = 0xce;
  x.super_base_blob<256U>.m_data._M_elems[1] = '|';
  x.super_base_blob<256U>.m_data._M_elems[2] = 0xf2;
  x.super_base_blob<256U>.m_data._M_elems[3] = 'r';
  x.super_base_blob<256U>.m_data._M_elems[4] = '/';
  x.super_base_blob<256U>.m_data._M_elems[5] = 'Q';
  x.super_base_blob<256U>.m_data._M_elems[6] = '\'';
  x.super_base_blob<256U>.m_data._M_elems[7] = 'q';
  hasher3.v[0] = CONCAT71(hasher3.v[0]._1_7_,
                          (undefined **)local_2c0._0_8_ == (undefined **)0x7127512f72f27cce);
  hasher3.v[1] = 0;
  hasher3.v[2] = 0;
  sip256.v[0] = (uint64_t)anon_var_dwarf_a95aad;
  sip256.v[1] = (long)
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/hash_tests.cpp"
                + 99;
  sip288.v[0] = (uint64_t)&local_2c0;
  ctx.super_RandomMixin<FastRandomContext>._8_8_ =
       ctx.super_RandomMixin<FastRandomContext>._8_8_ & 0xffffffffffffff00;
  ctx.super_RandomMixin<FastRandomContext>.bitbuf = (uint64_t)&PTR__lazy_ostream_01388f48;
  ctx.rng.m_aligned.input._0_8_ = boost::unit_test::lazy_ostream::inst;
  ctx.rng.m_aligned.input._8_8_ = &sip288;
  ss.ctx.s._8_8_ = ss.ctx.s._8_8_ & 0xffffffffffffff00;
  ss.ctx.s._0_8_ = &PTR__lazy_ostream_0138a900;
  ss.ctx.s._16_8_ = boost::unit_test::lazy_ostream::inst;
  ss.ctx.s._24_8_ = local_58;
  pvVar7 = (iterator)0x1;
  pvVar8 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&hasher3,(lazy_ostream *)&tx,1,2,REQUIRE,0xe74f75,(size_t)&sip256,
             0x6b,&ctx,"0x7127512f72f27cceull",&ss);
  boost::detail::shared_count::~shared_count((shared_count *)(hasher3.v + 2));
  CSipHasher::CSipHasher(&hasher2,0x706050403020100,0xf0e0d0c0b0a0908);
  x.super_base_blob<256U>.m_data._M_elems._0_8_ =
       x.super_base_blob<256U>.m_data._M_elems._0_8_ & 0xffffffffffffff00;
  local_530 = (undefined **)&siphash_4_2_testvec;
  do {
    local_418 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/hash_tests.cpp"
    ;
    local_410 = "";
    local_428 = &boost::unit_test::basic_cstring<char_const>::null;
    local_420 = &boost::unit_test::basic_cstring<char_const>::null;
    file_09.m_end = (iterator)0x71;
    file_09.m_begin = (iterator)&local_418;
    msg_09.m_end = pvVar8;
    msg_09.m_begin = pvVar7;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_428,
               msg_09);
    tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_finish._0_1_ = 0;
    tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)&PTR__lazy_ostream_01388f08;
    tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
    tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)anon_var_dwarf_a98d45;
    local_2c0._0_8_ = CSipHasher::Finalize(&hasher2);
    local_58._0_8_ = &siphash_4_2_testvec + (x.super_base_blob<256U>.m_data._M_elems._0_8_ & 0xff);
    hasher3.v[0] = CONCAT71(hasher3.v[0]._1_7_,
                            (undefined **)local_2c0._0_8_ ==
                            *(undefined ***)
                             (((uint256 *)local_58._0_8_)->super_base_blob<256U>).m_data._M_elems);
    hasher3.v[1] = 0;
    hasher3.v[2] = 0;
    sip256.v[0] = (uint64_t)anon_var_dwarf_a95aad;
    sip256.v[1] = (long)
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/hash_tests.cpp"
                  + 99;
    sip288.v[0] = (uint64_t)&local_2c0;
    ctx.super_RandomMixin<FastRandomContext>._8_8_ =
         ctx.super_RandomMixin<FastRandomContext>._8_8_ & 0xffffffffffffff00;
    ctx.super_RandomMixin<FastRandomContext>.bitbuf = (uint64_t)&PTR__lazy_ostream_01388f48;
    ctx.rng.m_aligned.input._0_8_ = boost::unit_test::lazy_ostream::inst;
    ctx.rng.m_aligned.input._8_8_ = &sip288;
    ss.ctx.s._8_8_ = ss.ctx.s._8_8_ & 0xffffffffffffff00;
    ss.ctx.s._0_8_ = &PTR__lazy_ostream_01388f48;
    ss.ctx.s._16_8_ = boost::unit_test::lazy_ostream::inst;
    ss.ctx.s._24_8_ = local_58;
    pvVar7 = (iterator)0x1;
    pvVar8 = (iterator)0x2;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&hasher3,(lazy_ostream *)&tx,1,2,REQUIRE,0xe74fff,(size_t)&sip256
               ,0x71,&ctx,"siphash_4_2_testvec[x]",&ss);
    boost::detail::shared_count::~shared_count((shared_count *)(hasher3.v + 2));
    data_04.m_size = 1;
    data_04.m_data = (uchar *)&x;
    CSipHasher::Write(&hasher2,data_04);
    bVar1 = x.super_base_blob<256U>.m_data._M_elems[0] + 1;
    x.super_base_blob<256U>.m_data._M_elems[0] = bVar1;
  } while (bVar1 < 0x40);
  CSipHasher::CSipHasher(&hasher3,0x706050403020100,0xf0e0d0c0b0a0908);
  uVar9 = 0x3020100;
  uVar10 = 0;
  uVar5 = 0;
  uVar6 = 0;
  uVar2 = 0;
  do {
    local_438 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/hash_tests.cpp"
    ;
    local_430 = "";
    local_448 = &boost::unit_test::basic_cstring<char_const>::null;
    local_440 = &boost::unit_test::basic_cstring<char_const>::null;
    file_10.m_end = (iterator)0x78;
    file_10.m_begin = (iterator)&local_438;
    msg_10.m_end = pvVar8;
    msg_10.m_begin = pvVar7;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_448,
               msg_10);
    tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_finish._0_1_ = 0;
    tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)&PTR__lazy_ostream_01388f08;
    tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
    tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)anon_var_dwarf_a98d45;
    x.super_base_blob<256U>.m_data._M_elems._0_8_ = CSipHasher::Finalize(&hasher3);
    sip256.v[0] = CONCAT71(sip256.v[0]._1_7_,
                           (undefined *)x.super_base_blob<256U>.m_data._M_elems._0_8_ == *local_530)
    ;
    sip256.v[1] = 0;
    sip256.v[2] = 0;
    sip288.v[0] = (uint64_t)anon_var_dwarf_a95aad;
    sip288.v[1] = (long)
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/hash_tests.cpp"
                  + 99;
    local_58._0_8_ = &x;
    ctx.super_RandomMixin<FastRandomContext>._8_8_ =
         ctx.super_RandomMixin<FastRandomContext>._8_8_ & 0xffffffffffffff00;
    ctx.super_RandomMixin<FastRandomContext>.bitbuf = (uint64_t)&PTR__lazy_ostream_01388f48;
    ctx.rng.m_aligned.input._0_8_ = boost::unit_test::lazy_ostream::inst;
    ctx.rng.m_aligned.input._8_8_ = local_58;
    local_2c0._0_8_ = local_530;
    ss.ctx.s._8_8_ = ss.ctx.s._8_8_ & 0xffffffffffffff00;
    ss.ctx.s._0_8_ = &PTR__lazy_ostream_01388f48;
    ss.ctx.s._16_8_ = boost::unit_test::lazy_ostream::inst;
    ss.ctx.s._24_8_ = &local_2c0;
    pvVar7 = (iterator)0x1;
    pvVar8 = (iterator)0x2;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&sip256,(lazy_ostream *)&tx,1,2,REQUIRE,0xe75029,(size_t)&sip288,
               0x78,&ctx,"siphash_4_2_testvec[x]",&ss);
    boost::detail::shared_count::~shared_count((shared_count *)(sip256.v + 2));
    CSipHasher::Write(&hasher3,uVar2 | 0x706050400000000 | uVar6 | uVar5 | uVar9 | uVar10);
    uVar6 = uVar6 + 0x800000000000000;
    uVar5 = uVar5 + 0x8000000000000;
    uVar10 = uVar10 + 0x80000000000;
    uVar9 = uVar9 + 0x808080800;
    local_530 = local_530 + 8;
    bVar11 = uVar2 < 0x38;
    uVar2 = uVar2 + 8;
  } while (bVar11);
  ss.ctx.buf[0x30] = '\0';
  ss.ctx.buf[0x31] = '\0';
  ss.ctx.buf[0x32] = '\0';
  ss.ctx.buf[0x33] = '\0';
  ss.ctx.buf[0x34] = '\0';
  ss.ctx.buf[0x35] = '\0';
  ss.ctx.buf[0x36] = '\0';
  ss.ctx.buf[0x37] = '\0';
  ss.ctx.buf[0x38] = '\0';
  ss.ctx.buf[0x39] = '\0';
  ss.ctx.buf[0x3a] = '\0';
  ss.ctx.buf[0x3b] = '\0';
  ss.ctx.buf[0x3c] = '\0';
  ss.ctx.buf[0x3d] = '\0';
  ss.ctx.buf[0x3e] = '\0';
  ss.ctx.buf[0x3f] = '\0';
  ss.ctx.buf[0x20] = '\0';
  ss.ctx.buf[0x21] = '\0';
  ss.ctx.buf[0x22] = '\0';
  ss.ctx.buf[0x23] = '\0';
  ss.ctx.buf[0x24] = '\0';
  ss.ctx.buf[0x25] = '\0';
  ss.ctx.buf[0x26] = '\0';
  ss.ctx.buf[0x27] = '\0';
  ss.ctx.buf[0x28] = '\0';
  ss.ctx.buf[0x29] = '\0';
  ss.ctx.buf[0x2a] = '\0';
  ss.ctx.buf[0x2b] = '\0';
  ss.ctx.buf[0x2c] = '\0';
  ss.ctx.buf[0x2d] = '\0';
  ss.ctx.buf[0x2e] = '\0';
  ss.ctx.buf[0x2f] = '\0';
  ss.ctx.buf[0x10] = '\0';
  ss.ctx.buf[0x11] = '\0';
  ss.ctx.buf[0x12] = '\0';
  ss.ctx.buf[0x13] = '\0';
  ss.ctx.buf[0x14] = '\0';
  ss.ctx.buf[0x15] = '\0';
  ss.ctx.buf[0x16] = '\0';
  ss.ctx.buf[0x17] = '\0';
  ss.ctx.buf[0x18] = '\0';
  ss.ctx.buf[0x19] = '\0';
  ss.ctx.buf[0x1a] = '\0';
  ss.ctx.buf[0x1b] = '\0';
  ss.ctx.buf[0x1c] = '\0';
  ss.ctx.buf[0x1d] = '\0';
  ss.ctx.buf[0x1e] = '\0';
  ss.ctx.buf[0x1f] = '\0';
  ss.ctx.buf[0] = '\0';
  ss.ctx.buf[1] = '\0';
  ss.ctx.buf[2] = '\0';
  ss.ctx.buf[3] = '\0';
  ss.ctx.buf[4] = '\0';
  ss.ctx.buf[5] = '\0';
  ss.ctx.buf[6] = '\0';
  ss.ctx.buf[7] = '\0';
  ss.ctx.buf[8] = '\0';
  ss.ctx.buf[9] = '\0';
  ss.ctx.buf[10] = '\0';
  ss.ctx.buf[0xb] = '\0';
  ss.ctx.buf[0xc] = '\0';
  ss.ctx.buf[0xd] = '\0';
  ss.ctx.buf[0xe] = '\0';
  ss.ctx.buf[0xf] = '\0';
  ss.ctx.s[4] = 0;
  ss.ctx.s[5] = 0;
  ss.ctx.s[6] = 0;
  ss.ctx.s[7] = 0;
  ss.ctx.s[0] = 0;
  ss.ctx.s[1] = 0;
  ss.ctx.s[2] = 0;
  ss.ctx.s[3] = 0;
  ss.ctx.bytes = 0;
  CSHA256::CSHA256(&ss.ctx);
  CMutableTransaction::CMutableTransaction(&tx);
  tx.version = 1;
  ctx.super_RandomMixin<FastRandomContext>.bitbuf = (uint64_t)&::TX_WITH_WITNESS;
  ctx.super_RandomMixin<FastRandomContext>._8_8_ = &ss.ctx;
  SerializeTransaction<ParamsStream<HashWriter&,TransactionSerParams>,CMutableTransaction>
            (&tx,(ParamsStream<HashWriter_&,_TransactionSerParams> *)&ctx,&::TX_WITH_WITNESS);
  local_490 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/hash_tests.cpp"
  ;
  local_488 = "";
  local_4a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_498 = &boost::unit_test::basic_cstring<char_const>::null;
  file_11.m_end = (iterator)0x83;
  file_11.m_begin = (iterator)&local_490;
  msg_11.m_end = pvVar8;
  msg_11.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_4a0,
             msg_11);
  sip288.v[1] = sip288.v[1] & 0xffffffffffffff00;
  sip288.v[0] = (uint64_t)&PTR__lazy_ostream_01388f08;
  sip288.v[2] = (uint64_t)boost::unit_test::lazy_ostream::inst;
  sip288.v[3] = (uint64_t)anon_var_dwarf_a98d45;
  HashWriter::GetHash((uint256 *)local_58,&ss);
  local_298 = (_func_int *)SipHashUint256(1,2,(uint256 *)local_58);
  local_4e0._vptr_lazy_ostream = &local_298;
  local_2c0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (readonly_property<bool>)(local_298 == (_func_int *)0x79751e980c2a0a35);
  local_288._0_8_ = &local_2a0;
  local_2a0 = (uint64_t *)0x79751e980c2a0a35;
  local_2c0.m_message.px = (element_type *)0x0;
  local_2c0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  x.super_base_blob<256U>.m_data._M_elems._0_8_ = anon_var_dwarf_a95aad;
  x.super_base_blob<256U>.m_data._M_elems._8_8_ =
       (long)
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/hash_tests.cpp"
       + 99;
  ctx.rng.m_aligned.input._8_8_ = &local_4e0;
  ctx.super_RandomMixin<FastRandomContext>._8_8_ =
       ctx.super_RandomMixin<FastRandomContext>._8_8_ & 0xffffffffffffff00;
  ctx.super_RandomMixin<FastRandomContext>.bitbuf = (uint64_t)&PTR__lazy_ostream_01388f48;
  ctx.rng.m_aligned.input._0_8_ = boost::unit_test::lazy_ostream::inst;
  sip256.v[3] = (uint64_t)&local_288;
  sip256.v[1] = sip256.v[1] & 0xffffffffffffff00;
  sip256.v[0] = (uint64_t)&PTR__lazy_ostream_0138a900;
  sip256.v[2] = (uint64_t)boost::unit_test::lazy_ostream::inst;
  pvVar7 = (iterator)0x1;
  pvVar8 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_2c0,(lazy_ostream *)&sip288,1,2,REQUIRE,0xe7503c,(size_t)&x,0x83,&ctx,
             "0x79751e980c2a0a35ULL",&sip256);
  boost::detail::shared_count::~shared_count(&local_2c0.m_message.pn);
  FastRandomContext::FastRandomContext(&ctx,false);
  iVar4 = 0x10;
  do {
    k0 = FastRandomContext::rand64(&ctx);
    k1 = FastRandomContext::rand64(&ctx);
    x.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
    x.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
    x.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
    x.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
    x.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
    x.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
    x.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
    x.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
    x.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
    x.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
    x.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
    x.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
    x.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
    x.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
    x.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
    x.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
    x.super_base_blob<256U>.m_data._M_elems[0] = '\0';
    x.super_base_blob<256U>.m_data._M_elems[1] = '\0';
    x.super_base_blob<256U>.m_data._M_elems[2] = '\0';
    x.super_base_blob<256U>.m_data._M_elems[3] = '\0';
    x.super_base_blob<256U>.m_data._M_elems[4] = '\0';
    x.super_base_blob<256U>.m_data._M_elems[5] = '\0';
    x.super_base_blob<256U>.m_data._M_elems[6] = '\0';
    x.super_base_blob<256U>.m_data._M_elems[7] = '\0';
    x.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    x.super_base_blob<256U>.m_data._M_elems[9] = '\0';
    x.super_base_blob<256U>.m_data._M_elems[10] = '\0';
    x.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
    x.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
    x.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
    x.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
    x.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
    output.m_size = 0x20;
    output.m_data = (byte *)&x;
    FastRandomContext::fillrand(&(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_rng,output);
    uVar3 = RandomMixin<FastRandomContext>::randbits<32>(&ctx.super_RandomMixin<FastRandomContext>);
    nb = SUB84(uVar3,0);
    CSipHasher::CSipHasher(&sip256,k0,k1);
    data_05.m_size = 0x20;
    data_05.m_data = (uchar *)&x;
    CSipHasher::Write(&sip256,data_05);
    sip288.tmp = sip256.tmp;
    sip288.count = sip256.count;
    sip288._41_7_ = sip256._41_7_;
    sip288.v[2] = sip256.v[2];
    sip288.v[3] = sip256.v[3];
    sip288.v[0] = sip256.v[0];
    sip288.v[1] = sip256.v[1];
    data_06.m_size = 4;
    data_06.m_data = nb;
    CSipHasher::Write(&sip288,data_06);
    local_4b0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/hash_tests.cpp"
    ;
    local_4a8 = "";
    local_4c0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_4b8 = &boost::unit_test::basic_cstring<char_const>::null;
    file_12.m_end = (iterator)0x92;
    file_12.m_begin = (iterator)&local_4b0;
    msg_12.m_end = pvVar8;
    msg_12.m_begin = pvVar7;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_4c0,
               msg_12);
    local_4e0.m_empty = false;
    local_4e0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
    local_4d0 = boost::unit_test::lazy_ostream::inst;
    local_4c8 = "";
    local_4e8 = SipHashUint256(k0,k1,&x);
    local_4f0 = CSipHasher::Finalize(&sip256);
    local_288.m_message.px = (element_type *)0x0;
    local_288.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_298 = (_func_int *)0xe74ab0;
    local_290 = "";
    local_2a0 = &local_4e8;
    local_58[8] = '\0';
    local_58._0_8_ = &PTR__lazy_ostream_01388f48;
    local_58._16_8_ = boost::unit_test::lazy_ostream::inst;
    local_40 = &local_2a0;
    local_2c8 = &local_4f0;
    local_2c0.m_message.px = (element_type *)((ulong)local_2c0.m_message.px & 0xffffffffffffff00);
    local_2c0._0_8_ = &PTR__lazy_ostream_01388f48;
    local_2c0.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_2a8 = &local_2c8;
    pvVar7 = (iterator)0x1;
    pvVar8 = (iterator)0x2;
    local_288.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(readonly_property<bool>)(local_4e8 == local_4f0);
    boost::test_tools::tt_detail::report_assertion
              (&local_288,&local_4e0,1,2,REQUIRE,0xe75075,(size_t)&local_298,0x92,local_58,
               "sip256.Finalize()",&local_2c0);
    boost::detail::shared_count::~shared_count(&local_288.m_message.pn);
    local_500 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/hash_tests.cpp"
    ;
    local_4f8 = "";
    local_510 = &boost::unit_test::basic_cstring<char_const>::null;
    local_508 = &boost::unit_test::basic_cstring<char_const>::null;
    file_13.m_end = (iterator)0x93;
    file_13.m_begin = (iterator)&local_500;
    msg_13.m_end = pvVar8;
    msg_13.m_begin = pvVar7;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_510,
               msg_13);
    local_4e0.m_empty = false;
    local_4e0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
    local_4d0 = boost::unit_test::lazy_ostream::inst;
    local_4c8 = "";
    local_4e8 = SipHashUint256Extra(k0,k1,&x,(uint32_t)SUB84(uVar3,0));
    local_4f0 = CSipHasher::Finalize(&sip288);
    local_288.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(readonly_property<bool>)(local_4e8 == local_4f0);
    local_288.m_message.px = (element_type *)0x0;
    local_288.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_298 = (_func_int *)0xe74ab0;
    local_290 = "";
    local_2a0 = &local_4e8;
    local_58[8] = '\0';
    local_58._0_8_ = &PTR__lazy_ostream_01388f48;
    local_58._16_8_ = boost::unit_test::lazy_ostream::inst;
    local_40 = &local_2a0;
    local_2c8 = &local_4f0;
    local_2c0.m_message.px = (element_type *)((ulong)local_2c0.m_message.px & 0xffffffffffffff00);
    local_2c0._0_8_ = &PTR__lazy_ostream_01388f48;
    local_2c0.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_2a8 = &local_2c8;
    pvVar7 = (iterator)0x1;
    pvVar8 = (iterator)0x2;
    boost::test_tools::tt_detail::report_assertion
              (&local_288,&local_4e0,1,2,REQUIRE,0xe750a1,(size_t)&local_298,0x93,local_58,
               "sip288.Finalize()",&local_2c0);
    boost::detail::shared_count::~shared_count(&local_288.m_message.pn);
    iVar4 = iVar4 + -1;
  } while (iVar4 != 0);
  ChaCha20::~ChaCha20(&ctx.rng);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&tx.vout);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector(&tx.vin);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(siphash)
{
    CSipHasher hasher(0x0706050403020100ULL, 0x0F0E0D0C0B0A0908ULL);
    BOOST_CHECK_EQUAL(hasher.Finalize(),  0x726fdb47dd0e0e31ull);
    static const unsigned char t0[1] = {0};
    hasher.Write(t0);
    BOOST_CHECK_EQUAL(hasher.Finalize(),  0x74f839c593dc67fdull);
    static const unsigned char t1[7] = {1,2,3,4,5,6,7};
    hasher.Write(t1);
    BOOST_CHECK_EQUAL(hasher.Finalize(),  0x93f5f5799a932462ull);
    hasher.Write(0x0F0E0D0C0B0A0908ULL);
    BOOST_CHECK_EQUAL(hasher.Finalize(),  0x3f2acc7f57c29bdbull);
    static const unsigned char t2[2] = {16,17};
    hasher.Write(t2);
    BOOST_CHECK_EQUAL(hasher.Finalize(),  0x4bc1b3f0968dd39cull);
    static const unsigned char t3[9] = {18,19,20,21,22,23,24,25,26};
    hasher.Write(t3);
    BOOST_CHECK_EQUAL(hasher.Finalize(),  0x2f2e6163076bcfadull);
    static const unsigned char t4[5] = {27,28,29,30,31};
    hasher.Write(t4);
    BOOST_CHECK_EQUAL(hasher.Finalize(),  0x7127512f72f27cceull);
    hasher.Write(0x2726252423222120ULL);
    BOOST_CHECK_EQUAL(hasher.Finalize(),  0x0e3ea96b5304a7d0ull);
    hasher.Write(0x2F2E2D2C2B2A2928ULL);
    BOOST_CHECK_EQUAL(hasher.Finalize(),  0xe612a3cb9ecba951ull);

    BOOST_CHECK_EQUAL(SipHashUint256(0x0706050403020100ULL, 0x0F0E0D0C0B0A0908ULL, uint256{"1f1e1d1c1b1a191817161514131211100f0e0d0c0b0a09080706050403020100"}), 0x7127512f72f27cceull);

    // Check test vectors from spec, one byte at a time
    CSipHasher hasher2(0x0706050403020100ULL, 0x0F0E0D0C0B0A0908ULL);
    for (uint8_t x=0; x<std::size(siphash_4_2_testvec); ++x)
    {
        BOOST_CHECK_EQUAL(hasher2.Finalize(), siphash_4_2_testvec[x]);
        hasher2.Write(Span{&x, 1});
    }
    // Check test vectors from spec, eight bytes at a time
    CSipHasher hasher3(0x0706050403020100ULL, 0x0F0E0D0C0B0A0908ULL);
    for (uint8_t x=0; x<std::size(siphash_4_2_testvec); x+=8)
    {
        BOOST_CHECK_EQUAL(hasher3.Finalize(), siphash_4_2_testvec[x]);
        hasher3.Write(uint64_t(x)|(uint64_t(x+1)<<8)|(uint64_t(x+2)<<16)|(uint64_t(x+3)<<24)|
                     (uint64_t(x+4)<<32)|(uint64_t(x+5)<<40)|(uint64_t(x+6)<<48)|(uint64_t(x+7)<<56));
    }

    HashWriter ss{};
    CMutableTransaction tx;
    // Note these tests were originally written with tx.version=1
    // and the test would be affected by default tx version bumps if not fixed.
    tx.version = 1;
    ss << TX_WITH_WITNESS(tx);
    BOOST_CHECK_EQUAL(SipHashUint256(1, 2, ss.GetHash()), 0x79751e980c2a0a35ULL);

    // Check consistency between CSipHasher and SipHashUint256[Extra].
    FastRandomContext ctx;
    for (int i = 0; i < 16; ++i) {
        uint64_t k1 = ctx.rand64();
        uint64_t k2 = ctx.rand64();
        uint256 x = m_rng.rand256();
        uint32_t n = ctx.rand32();
        uint8_t nb[4];
        WriteLE32(nb, n);
        CSipHasher sip256(k1, k2);
        sip256.Write(x);
        CSipHasher sip288 = sip256;
        sip288.Write(nb);
        BOOST_CHECK_EQUAL(SipHashUint256(k1, k2, x), sip256.Finalize());
        BOOST_CHECK_EQUAL(SipHashUint256Extra(k1, k2, x, n), sip288.Finalize());
    }
}